

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::crn_unpacker::unpack_dxt1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  uint uVar1;
  block_buffer_element *pbVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint8 *puVar12;
  uint min_new_capacity;
  uint local_b0;
  uint local_ac;
  uint8 *local_a0;
  byte bVar5;
  
  uVar1 = (this->m_color_endpoints).m_size;
  uVar10 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  if (uVar10 < min_new_capacity) {
    if ((min_new_capacity <= (this->m_block_buffer).m_capacity) ||
       (bVar3 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_block_buffer,min_new_capacity,
                           uVar10 + 1 == min_new_capacity,8,(object_mover)0x0), bVar3)) {
      (this->m_block_buffer).m_size = min_new_capacity;
    }
    else {
      (this->m_block_buffer).m_alloc_failed = true;
    }
  }
  if ((this->m_pHeader->m_faces).m_buf[0] != '\0') {
    uVar7 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar9 = 0;
    uVar10 = 0;
    local_ac = 0;
    do {
      if (uVar7 != 0) {
        local_a0 = pDst[uVar9];
        local_b0 = 0;
        do {
          puVar12 = local_a0;
          if (min_new_capacity != 0) {
            bVar3 = local_b0 < output_height;
            uVar11 = 0;
            do {
              if (((local_b0 | (uint)uVar11) & 1) == 0) {
                local_ac = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
              }
              pbVar2 = (this->m_block_buffer).m_p;
              if ((local_b0 & 1) == 0) {
                bVar5 = (byte)local_ac;
                bVar4 = bVar5 & 3;
                pbVar2[uVar11].endpoint_reference = (ushort)(bVar5 >> 2 & 3);
                local_ac = (uint)(bVar5 >> 4);
              }
              else {
                bVar4 = (byte)pbVar2[uVar11].endpoint_reference;
              }
              if (bVar4 == 1) {
                pbVar2[uVar11].color_endpoint_index = (uint16)uVar10;
              }
              else if (bVar4 == 0) {
                uVar6 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
                uVar8 = 0;
                if (uVar1 <= uVar6 + uVar10) {
                  uVar8 = uVar1;
                }
                uVar10 = (uVar6 + uVar10) - uVar8;
                pbVar2[uVar11].color_endpoint_index = (uint16)uVar10;
              }
              else {
                uVar10 = (uint)pbVar2[uVar11].color_endpoint_index;
              }
              bVar3 = (bool)(bVar3 & uVar11 < output_width);
              uVar6 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
              if (bVar3) {
                *(uint *)(local_a0 + uVar11 * 8) = (this->m_color_endpoints).m_p[uVar10];
                *(uint *)(local_a0 + uVar11 * 8 + 4) = (this->m_color_selectors).m_p[uVar6];
              }
              uVar11 = uVar11 + 1;
              puVar12 = puVar12 + 8;
            } while (min_new_capacity != uVar11);
          }
          local_b0 = local_b0 + 1;
          local_a0 = puVar12 + (long)(int)((output_pitch_in_bytes >> 2) + min_new_capacity * -2) * 4
          ;
        } while (local_b0 != uVar7);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->m_pHeader->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxt1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (visible) {
            pData[0] = m_color_endpoints[color_endpoint_index];
            pData[1] = m_color_selectors[color_selector_index];
          }
        }
      }
    }
    return true;
  }